

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

void MRIStepCoupling_Free(MRIStepCoupling MRIC)

{
  void *in_RDI;
  int i;
  int k;
  undefined4 local_10;
  undefined4 local_c;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      free(*(void **)((long)in_RDI + 0x18));
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      for (local_c = 0; local_c < *(int *)((long)in_RDI + 4); local_c = local_c + 1) {
        if (*(long *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 8) != 0) {
          for (local_10 = 0; local_10 <= *(int *)((long)in_RDI + 8); local_10 = local_10 + 1) {
            if (*(long *)(*(long *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 8) +
                         (long)local_10 * 8) != 0) {
              free(*(void **)(*(long *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 8) +
                             (long)local_10 * 8));
              *(undefined8 *)
               (*(long *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 8) + (long)local_10 * 8)
                   = 0;
            }
          }
          free(*(void **)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 8));
          *(undefined8 *)(*(long *)((long)in_RDI + 0x20) + (long)local_c * 8) = 0;
        }
      }
      free(*(void **)((long)in_RDI + 0x20));
    }
    if (*(long *)((long)in_RDI + 0x28) != 0) {
      for (local_c = 0; local_c < *(int *)((long)in_RDI + 4); local_c = local_c + 1) {
        if (*(long *)(*(long *)((long)in_RDI + 0x28) + (long)local_c * 8) != 0) {
          for (local_10 = 0; local_10 <= *(int *)((long)in_RDI + 8); local_10 = local_10 + 1) {
            if (*(long *)(*(long *)(*(long *)((long)in_RDI + 0x28) + (long)local_c * 8) +
                         (long)local_10 * 8) != 0) {
              free(*(void **)(*(long *)(*(long *)((long)in_RDI + 0x28) + (long)local_c * 8) +
                             (long)local_10 * 8));
              *(undefined8 *)
               (*(long *)(*(long *)((long)in_RDI + 0x28) + (long)local_c * 8) + (long)local_10 * 8)
                   = 0;
            }
          }
          free(*(void **)(*(long *)((long)in_RDI + 0x28) + (long)local_c * 8));
          *(undefined8 *)(*(long *)((long)in_RDI + 0x28) + (long)local_c * 8) = 0;
        }
      }
      free(*(void **)((long)in_RDI + 0x28));
    }
    if (*(long *)((long)in_RDI + 0x38) != 0) {
      for (local_10 = 0; local_10 < *(int *)((long)in_RDI + 8); local_10 = local_10 + 1) {
        if (*(long *)(*(long *)((long)in_RDI + 0x38) + (long)local_10 * 8) != 0) {
          free(*(void **)(*(long *)((long)in_RDI + 0x38) + (long)local_10 * 8));
          *(undefined8 *)(*(long *)((long)in_RDI + 0x38) + (long)local_10 * 8) = 0;
        }
      }
      free(*(void **)((long)in_RDI + 0x38));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void MRIStepCoupling_Free(MRIStepCoupling MRIC)
{
  int k, i;

  /* Free each field within MRIStepCoupling structure, and then
     free structure itself */
  if (MRIC)
  {
    if (MRIC->c) { free(MRIC->c); }

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        if (MRIC->W[k])
        {
          for (i = 0; i <= MRIC->stages; i++)
          {
            if (MRIC->W[k][i])
            {
              free(MRIC->W[k][i]);
              MRIC->W[k][i] = NULL;
            }
          }
          free(MRIC->W[k]);
          MRIC->W[k] = NULL;
        }
      }
      free(MRIC->W);
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        if (MRIC->G[k])
        {
          for (i = 0; i <= MRIC->stages; i++)
          {
            if (MRIC->G[k][i])
            {
              free(MRIC->G[k][i]);
              MRIC->G[k][i] = NULL;
            }
          }
          free(MRIC->G[k]);
          MRIC->G[k] = NULL;
        }
      }
      free(MRIC->G);
    }

    if (MRIC->group)
    {
      for (i = 0; i < MRIC->stages; i++)
      {
        if (MRIC->group[i])
        {
          free(MRIC->group[i]);
          MRIC->group[i] = NULL;
        }
      }
      free(MRIC->group);
    }

    free(MRIC);
  }
}